

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint32_t helper_pack_tricore(uint32_t carry,uint32_t r1_low,uint32_t r1_high,
                            target_ulong_conflict r2)

{
  uint uVar1;
  int32_t int_exp;
  int32_t int_mant;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  
  uVar1 = 0;
  if (((char)r1_low < '\0') && (uVar1 = 1, (r1_low & 0x17f) == 0)) {
    uVar1 = (uint)(carry != 0);
  }
  if (r1_high == 0xff && (r1_low & 0x80000000) == 0) {
    uVar2 = r1_low >> 8;
    uVar3 = 0x7f800000;
  }
  else {
    bVar4 = (byte)(r1_low >> 0x1f);
    if ((bVar4 & 0x7e < (int)r1_high) == 0) {
      uVar2 = 0;
      if (r1_low == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = 0;
        if ((bVar4 & (int)r1_high < -0x7f) == 0) {
          uVar1 = uVar1 + (r1_low >> 8 & 0x7fffff |
                          ((r1_high & 0xff) << 0x17 ^ 0x40000000) & (int)r1_low >> 0x1f);
          uVar3 = uVar1 & 0x7f800000;
          uVar2 = uVar1 & 0x7fffff;
        }
      }
    }
    else {
      uVar3 = 0x7f800000;
      uVar2 = 0;
    }
  }
  return r2 & 0x80000000 | uVar2 | uVar3;
}

Assistant:

uint32_t helper_pack(uint32_t carry, uint32_t r1_low, uint32_t r1_high,
                     target_ulong r2)
{
    uint32_t ret;
    int32_t fp_exp, fp_frac, temp_exp, fp_exp_frac;
    int32_t int_exp  = r1_high;
    int32_t int_mant = r1_low;
    uint32_t flag_rnd = (int_mant & (1 << 7)) && (
                        (int_mant & (1 << 8)) ||
                        (int_mant & 0x7f)     ||
                        (carry != 0));
    if (((int_mant & (1<<31)) == 0) && (int_exp == 255)) {
        fp_exp = 255;
        fp_frac = extract32(int_mant, 8, 23);
    } else if ((int_mant & (1<<31)) && (int_exp >= 127)) {
        fp_exp  = 255;
        fp_frac = 0;
    } else if ((int_mant & (1<<31)) && (int_exp <= -128)) {
        fp_exp  = 0;
        fp_frac = 0;
    } else if (int_mant == 0) {
        fp_exp  = 0;
        fp_frac = 0;
    } else {
        if (((int_mant & (1 << 31)) == 0)) {
            temp_exp = 0;
        } else {
            temp_exp = int_exp + 128;
        }
        fp_exp_frac = (((temp_exp & 0xff) << 23) |
                      extract32(int_mant, 8, 23))
                      + flag_rnd;
        fp_exp  = extract32(fp_exp_frac, 23, 8);
        fp_frac = extract32(fp_exp_frac, 0, 23);
    }
    ret = r2 & (1 << 31);
    ret = ret + (fp_exp << 23);
    ret = ret + (fp_frac & 0x7fffff);

    return ret;
}